

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p256_64.h
# Opt level: O0

void fiat_p256_mul(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  int iVar1;
  uint64_t local_5f8;
  uint64_t x187;
  uint64_t x186;
  uint64_t x185;
  uint64_t x184;
  fiat_p256_uint1 x183;
  uint64_t x182;
  uint64_t uStack_5c0;
  fiat_p256_uint1 x181;
  uint64_t x180;
  uint64_t uStack_5b0;
  fiat_p256_uint1 x179;
  uint64_t x178;
  uint64_t uStack_5a0;
  fiat_p256_uint1 x177;
  uint64_t x176;
  uint64_t uStack_590;
  fiat_p256_uint1 x175;
  uint64_t x174;
  uint64_t x173;
  uint64_t uStack_578;
  fiat_p256_uint1 x172;
  uint64_t x171;
  uint64_t uStack_568;
  fiat_p256_uint1 x170;
  uint64_t x169;
  uint64_t uStack_558;
  fiat_p256_uint1 x168;
  uint64_t x167;
  uint64_t uStack_548;
  fiat_p256_uint1 x166;
  uint64_t x165;
  fiat_p256_uint1 x164;
  uint64_t x163;
  uint64_t x162;
  uint64_t uStack_520;
  fiat_p256_uint1 x161;
  uint64_t x160;
  uint64_t x159;
  uint64_t x158;
  uint64_t x157;
  uint64_t x156;
  uint64_t x155;
  uint64_t x154;
  uint64_t uStack_4e0;
  fiat_p256_uint1 x153;
  uint64_t x152;
  uint64_t uStack_4d0;
  fiat_p256_uint1 x151;
  uint64_t x150;
  uint64_t uStack_4c0;
  fiat_p256_uint1 x149;
  uint64_t x148;
  uint64_t uStack_4b0;
  fiat_p256_uint1 x147;
  uint64_t x146;
  uint64_t uStack_4a0;
  fiat_p256_uint1 x145;
  uint64_t x144;
  uint64_t x143;
  uint64_t uStack_488;
  fiat_p256_uint1 x142;
  uint64_t x141;
  uint64_t uStack_478;
  fiat_p256_uint1 x140;
  uint64_t x139;
  uint64_t uStack_468;
  fiat_p256_uint1 x138;
  uint64_t x137;
  uint64_t x136;
  uint64_t x135;
  uint64_t x134;
  uint64_t x133;
  uint64_t x132;
  uint64_t x131;
  uint64_t x130;
  uint64_t x129;
  uint64_t x128;
  uint64_t uStack_410;
  fiat_p256_uint1 x127;
  uint64_t x126;
  uint64_t uStack_400;
  fiat_p256_uint1 x125;
  uint64_t x124;
  uint64_t uStack_3f0;
  fiat_p256_uint1 x123;
  uint64_t x122;
  uint64_t uStack_3e0;
  fiat_p256_uint1 x121;
  uint64_t x120;
  fiat_p256_uint1 x119;
  uint64_t x118;
  uint64_t x117;
  uint64_t uStack_3b8;
  fiat_p256_uint1 x116;
  uint64_t x115;
  uint64_t x114;
  uint64_t x113;
  uint64_t x112;
  uint64_t x111;
  uint64_t x110;
  uint64_t x109;
  uint64_t uStack_378;
  fiat_p256_uint1 x108;
  uint64_t x107;
  uint64_t uStack_368;
  fiat_p256_uint1 x106;
  uint64_t x105;
  uint64_t uStack_358;
  fiat_p256_uint1 x104;
  uint64_t x103;
  uint64_t uStack_348;
  fiat_p256_uint1 x102;
  uint64_t x101;
  uint64_t uStack_338;
  fiat_p256_uint1 x100;
  uint64_t x99;
  uint64_t x98;
  uint64_t uStack_320;
  fiat_p256_uint1 x97;
  uint64_t x96;
  uint64_t uStack_310;
  fiat_p256_uint1 x95;
  uint64_t x94;
  uint64_t uStack_300;
  fiat_p256_uint1 x93;
  uint64_t x92;
  uint64_t x91;
  uint64_t x90;
  uint64_t x89;
  uint64_t x88;
  uint64_t x87;
  uint64_t x86;
  uint64_t x85;
  uint64_t x84;
  uint64_t x83;
  uint64_t uStack_2a8;
  fiat_p256_uint1 x82;
  uint64_t x81;
  uint64_t uStack_298;
  fiat_p256_uint1 x80;
  uint64_t x79;
  uint64_t uStack_288;
  fiat_p256_uint1 x78;
  uint64_t x77;
  uint64_t uStack_278;
  fiat_p256_uint1 x76;
  uint64_t x75;
  fiat_p256_uint1 x74;
  uint64_t x73;
  uint64_t x72;
  uint64_t uStack_250;
  fiat_p256_uint1 x71;
  uint64_t x70;
  uint64_t x69;
  uint64_t x68;
  uint64_t x67;
  uint64_t x66;
  uint64_t x65;
  uint64_t x64;
  uint64_t uStack_210;
  fiat_p256_uint1 x63;
  uint64_t x62;
  uint64_t uStack_200;
  fiat_p256_uint1 x61;
  uint64_t x60;
  uint64_t uStack_1f0;
  fiat_p256_uint1 x59;
  uint64_t x58;
  uint64_t uStack_1e0;
  fiat_p256_uint1 x57;
  uint64_t x56;
  uint64_t uStack_1d0;
  fiat_p256_uint1 x55;
  uint64_t x54;
  uint64_t x53;
  uint64_t uStack_1b8;
  fiat_p256_uint1 x52;
  uint64_t x51;
  uint64_t uStack_1a8;
  fiat_p256_uint1 x50;
  uint64_t x49;
  uint64_t uStack_198;
  fiat_p256_uint1 x48;
  uint64_t x47;
  uint64_t x46;
  uint64_t x45;
  uint64_t x44;
  uint64_t x43;
  uint64_t x42;
  uint64_t x41;
  uint64_t x40;
  uint64_t x39;
  uint64_t uStack_148;
  fiat_p256_uint1 x38;
  uint64_t x37;
  uint64_t uStack_138;
  fiat_p256_uint1 x36;
  uint64_t x35;
  uint64_t uStack_128;
  fiat_p256_uint1 x34;
  uint64_t x33;
  uint64_t uStack_118;
  fiat_p256_uint1 x32;
  uint64_t x31;
  fiat_p256_uint1 x30;
  uint64_t x29;
  uint64_t x28;
  uint64_t uStack_f0;
  fiat_p256_uint1 x27;
  uint64_t x26;
  uint64_t x25;
  uint64_t x24;
  uint64_t x23;
  uint64_t x22;
  uint64_t x21;
  uint64_t x20;
  uint64_t x19;
  uint64_t uStack_a8;
  fiat_p256_uint1 x18;
  uint64_t x17;
  uint64_t uStack_98;
  fiat_p256_uint1 x16;
  uint64_t x15;
  uint64_t uStack_88;
  fiat_p256_uint1 x14;
  uint64_t x13;
  uint64_t x12;
  uint64_t x11;
  uint64_t x10;
  uint64_t x9;
  uint64_t x8;
  uint64_t x7;
  uint64_t x6;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  uint64_t *arg2_local;
  uint64_t *arg1_local;
  uint64_t *out1_local;
  
  x1 = (uint64_t)arg2;
  arg2_local = arg1;
  arg1_local = out1;
  iVar1 = CRYPTO_is_BMI1_capable();
  if (((iVar1 != 0) && (iVar1 = CRYPTO_is_BMI2_capable(), iVar1 != 0)) &&
     (iVar1 = CRYPTO_is_ADX_capable(), iVar1 != 0)) {
    fiat_p256_adx_mul(arg1_local,arg2_local,x1);
    return;
  }
  x2 = arg2_local[1];
  x3 = arg2_local[2];
  x4 = arg2_local[3];
  x5 = *arg2_local;
  fiat_p256_mulx_u64(&x6,&x7,x5,*(uint64_t *)(x1 + 0x18));
  fiat_p256_mulx_u64(&x8,&x9,x5,*(uint64_t *)(x1 + 0x10));
  fiat_p256_mulx_u64(&x10,&x11,x5,*(uint64_t *)(x1 + 8));
  fiat_p256_mulx_u64(&x12,&x13,x5,*(uint64_t *)x1);
  fiat_p256_addcarryx_u64(&stack0xffffffffffffff78,(fiat_p256_uint1 *)((long)&x15 + 7),'\0',x13,x10)
  ;
  fiat_p256_addcarryx_u64
            (&stack0xffffffffffffff68,(fiat_p256_uint1 *)((long)&x17 + 7),x15._7_1_,x11,x8);
  fiat_p256_addcarryx_u64
            (&stack0xffffffffffffff58,(fiat_p256_uint1 *)((long)&x19 + 7),x17._7_1_,x9,x6);
  x20 = x19._7_1_ + x7;
  fiat_p256_mulx_u64(&x21,&x22,x12,0xffffffff00000001);
  fiat_p256_mulx_u64(&x23,&x24,x12,0xffffffff);
  fiat_p256_mulx_u64(&x25,&x26,x12,0xffffffffffffffff);
  fiat_p256_addcarryx_u64(&stack0xffffffffffffff10,(fiat_p256_uint1 *)((long)&x28 + 7),'\0',x26,x23)
  ;
  x29 = x28._7_1_ + x24;
  fiat_p256_addcarryx_u64
            ((uint64_t *)&stack0xfffffffffffffef8,(fiat_p256_uint1 *)((long)&x31 + 7),'\0',x12,x25);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffee8,(fiat_p256_uint1 *)((long)&x33 + 7),x31._7_1_,uStack_88,
             uStack_f0);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffed8,(fiat_p256_uint1 *)((long)&x35 + 7),x33._7_1_,uStack_98,x29);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffec8,(fiat_p256_uint1 *)((long)&x37 + 7),x35._7_1_,uStack_a8,x21);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffeb8,(fiat_p256_uint1 *)((long)&x39 + 7),x37._7_1_,x20,x22);
  fiat_p256_mulx_u64(&x40,&x41,x2,*(uint64_t *)(x1 + 0x18));
  fiat_p256_mulx_u64(&x42,&x43,x2,*(uint64_t *)(x1 + 0x10));
  fiat_p256_mulx_u64(&x44,&x45,x2,*(uint64_t *)(x1 + 8));
  fiat_p256_mulx_u64(&x46,&x47,x2,*(uint64_t *)x1);
  fiat_p256_addcarryx_u64(&stack0xfffffffffffffe68,(fiat_p256_uint1 *)((long)&x49 + 7),'\0',x47,x44)
  ;
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffe58,(fiat_p256_uint1 *)((long)&x51 + 7),x49._7_1_,x45,x42);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffe48,(fiat_p256_uint1 *)((long)&x53 + 7),x51._7_1_,x43,x40);
  x54 = x53._7_1_ + x41;
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffe30,(fiat_p256_uint1 *)((long)&x56 + 7),'\0',uStack_118,x46);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffe20,(fiat_p256_uint1 *)((long)&x58 + 7),x56._7_1_,uStack_128,
             uStack_198);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffe10,(fiat_p256_uint1 *)((long)&x60 + 7),x58._7_1_,uStack_138,
             uStack_1a8);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffe00,(fiat_p256_uint1 *)((long)&x62 + 7),x60._7_1_,uStack_148,
             uStack_1b8);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffdf0,(fiat_p256_uint1 *)((long)&x64 + 7),x62._7_1_,(ulong)x39._7_1_
             ,x54);
  fiat_p256_mulx_u64(&x65,&x66,uStack_1d0,0xffffffff00000001);
  fiat_p256_mulx_u64(&x67,&x68,uStack_1d0,0xffffffff);
  fiat_p256_mulx_u64(&x69,&x70,uStack_1d0,0xffffffffffffffff);
  fiat_p256_addcarryx_u64(&stack0xfffffffffffffdb0,(fiat_p256_uint1 *)((long)&x72 + 7),'\0',x70,x67)
  ;
  x73 = x72._7_1_ + x68;
  fiat_p256_addcarryx_u64
            ((uint64_t *)&stack0xfffffffffffffd98,(fiat_p256_uint1 *)((long)&x75 + 7),'\0',
             uStack_1d0,x69);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffd88,(fiat_p256_uint1 *)((long)&x77 + 7),x75._7_1_,uStack_1e0,
             uStack_250);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffd78,(fiat_p256_uint1 *)((long)&x79 + 7),x77._7_1_,uStack_1f0,x73);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffd68,(fiat_p256_uint1 *)((long)&x81 + 7),x79._7_1_,uStack_200,x65);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffd58,(fiat_p256_uint1 *)((long)&x83 + 7),x81._7_1_,uStack_210,x66);
  x84 = (ulong)x83._7_1_ + (ulong)x64._7_1_;
  fiat_p256_mulx_u64(&x85,&x86,x3,*(uint64_t *)(x1 + 0x18));
  fiat_p256_mulx_u64(&x87,&x88,x3,*(uint64_t *)(x1 + 0x10));
  fiat_p256_mulx_u64(&x89,&x90,x3,*(uint64_t *)(x1 + 8));
  fiat_p256_mulx_u64(&x91,&x92,x3,*(uint64_t *)x1);
  fiat_p256_addcarryx_u64(&stack0xfffffffffffffd00,(fiat_p256_uint1 *)((long)&x94 + 7),'\0',x92,x89)
  ;
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffcf0,(fiat_p256_uint1 *)((long)&x96 + 7),x94._7_1_,x90,x87);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffce0,(fiat_p256_uint1 *)((long)&x98 + 7),x96._7_1_,x88,x85);
  x99 = x98._7_1_ + x86;
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffcc8,(fiat_p256_uint1 *)((long)&x101 + 7),'\0',uStack_278,x91);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffcb8,(fiat_p256_uint1 *)((long)&x103 + 7),x101._7_1_,uStack_288,
             uStack_300);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffca8,(fiat_p256_uint1 *)((long)&x105 + 7),x103._7_1_,uStack_298,
             uStack_310);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffc98,(fiat_p256_uint1 *)((long)&x107 + 7),x105._7_1_,uStack_2a8,
             uStack_320);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffc88,(fiat_p256_uint1 *)((long)&x109 + 7),x107._7_1_,x84,x99);
  fiat_p256_mulx_u64(&x110,&x111,uStack_338,0xffffffff00000001);
  fiat_p256_mulx_u64(&x112,&x113,uStack_338,0xffffffff);
  fiat_p256_mulx_u64(&x114,&x115,uStack_338,0xffffffffffffffff);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffc48,(fiat_p256_uint1 *)((long)&x117 + 7),'\0',x115,x112);
  x118 = x117._7_1_ + x113;
  fiat_p256_addcarryx_u64
            ((uint64_t *)&stack0xfffffffffffffc30,(fiat_p256_uint1 *)((long)&x120 + 7),'\0',
             uStack_338,x114);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffc20,(fiat_p256_uint1 *)((long)&x122 + 7),x120._7_1_,uStack_348,
             uStack_3b8);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffc10,(fiat_p256_uint1 *)((long)&x124 + 7),x122._7_1_,uStack_358,
             x118);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffc00,(fiat_p256_uint1 *)((long)&x126 + 7),x124._7_1_,uStack_368,
             x110);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffbf0,(fiat_p256_uint1 *)((long)&x128 + 7),x126._7_1_,uStack_378,
             x111);
  x129 = (ulong)x128._7_1_ + (ulong)x109._7_1_;
  fiat_p256_mulx_u64(&x130,&x131,x4,*(uint64_t *)(x1 + 0x18));
  fiat_p256_mulx_u64(&x132,&x133,x4,*(uint64_t *)(x1 + 0x10));
  fiat_p256_mulx_u64(&x134,&x135,x4,*(uint64_t *)(x1 + 8));
  fiat_p256_mulx_u64(&x136,&x137,x4,*(uint64_t *)x1);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffb98,(fiat_p256_uint1 *)((long)&x139 + 7),'\0',x137,x134);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffb88,(fiat_p256_uint1 *)((long)&x141 + 7),x139._7_1_,x135,x132);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffb78,(fiat_p256_uint1 *)((long)&x143 + 7),x141._7_1_,x133,x130);
  x144 = x143._7_1_ + x131;
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffb60,(fiat_p256_uint1 *)((long)&x146 + 7),'\0',uStack_3e0,x136);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffb50,(fiat_p256_uint1 *)((long)&x148 + 7),x146._7_1_,uStack_3f0,
             uStack_468);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffb40,(fiat_p256_uint1 *)((long)&x150 + 7),x148._7_1_,uStack_400,
             uStack_478);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffb30,(fiat_p256_uint1 *)((long)&x152 + 7),x150._7_1_,uStack_410,
             uStack_488);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffb20,(fiat_p256_uint1 *)((long)&x154 + 7),x152._7_1_,x129,x144);
  fiat_p256_mulx_u64(&x155,&x156,uStack_4a0,0xffffffff00000001);
  fiat_p256_mulx_u64(&x157,&x158,uStack_4a0,0xffffffff);
  fiat_p256_mulx_u64(&x159,&x160,uStack_4a0,0xffffffffffffffff);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffae0,(fiat_p256_uint1 *)((long)&x162 + 7),'\0',x160,x157);
  x163 = x162._7_1_ + x158;
  fiat_p256_addcarryx_u64
            ((uint64_t *)&stack0xfffffffffffffac8,(fiat_p256_uint1 *)((long)&x165 + 7),'\0',
             uStack_4a0,x159);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffab8,(fiat_p256_uint1 *)((long)&x167 + 7),x165._7_1_,uStack_4b0,
             uStack_520);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffaa8,(fiat_p256_uint1 *)((long)&x169 + 7),x167._7_1_,uStack_4c0,
             x163);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffa98,(fiat_p256_uint1 *)((long)&x171 + 7),x169._7_1_,uStack_4d0,
             x155);
  fiat_p256_addcarryx_u64
            (&stack0xfffffffffffffa88,(fiat_p256_uint1 *)((long)&x173 + 7),x171._7_1_,uStack_4e0,
             x156);
  x174 = (ulong)x173._7_1_ + (ulong)x154._7_1_;
  fiat_p256_subborrowx_u64
            (&stack0xfffffffffffffa70,(fiat_p256_uint1 *)((long)&x176 + 7),'\0',uStack_548,
             0xffffffffffffffff);
  fiat_p256_subborrowx_u64
            (&stack0xfffffffffffffa60,(fiat_p256_uint1 *)((long)&x178 + 7),x176._7_1_,uStack_558,
             0xffffffff);
  fiat_p256_subborrowx_u64
            (&stack0xfffffffffffffa50,(fiat_p256_uint1 *)((long)&x180 + 7),x178._7_1_,uStack_568,0);
  fiat_p256_subborrowx_u64
            (&stack0xfffffffffffffa40,(fiat_p256_uint1 *)((long)&x182 + 7),x180._7_1_,uStack_578,
             0xffffffff00000001);
  fiat_p256_subborrowx_u64
            ((uint64_t *)&stack0xfffffffffffffa30,(fiat_p256_uint1 *)((long)&x184 + 7),x182._7_1_,
             x174,0);
  fiat_p256_cmovznz_u64(&x185,x184._7_1_,uStack_590,uStack_548);
  fiat_p256_cmovznz_u64(&x186,x184._7_1_,uStack_5a0,uStack_558);
  fiat_p256_cmovznz_u64(&x187,x184._7_1_,uStack_5b0,uStack_568);
  fiat_p256_cmovznz_u64(&local_5f8,x184._7_1_,uStack_5c0,uStack_578);
  *arg1_local = x185;
  arg1_local[1] = x186;
  arg1_local[2] = x187;
  arg1_local[3] = local_5f8;
  return;
}

Assistant:

static FIAT_P256_FIAT_INLINE void fiat_p256_mul(fiat_p256_montgomery_domain_field_element out1, const fiat_p256_montgomery_domain_field_element arg1, const fiat_p256_montgomery_domain_field_element arg2) {
#if !defined(OPENSSL_NO_ASM) && defined(__GNUC__) && defined(__x86_64__)
  if (CRYPTO_is_BMI1_capable() && CRYPTO_is_BMI2_capable() &&
    CRYPTO_is_ADX_capable()) {
      fiat_p256_adx_mul(out1, arg1, arg2);
      return;
  }
#endif
  uint64_t x1;
  uint64_t x2;
  uint64_t x3;
  uint64_t x4;
  uint64_t x5;
  uint64_t x6;
  uint64_t x7;
  uint64_t x8;
  uint64_t x9;
  uint64_t x10;
  uint64_t x11;
  uint64_t x12;
  uint64_t x13;
  fiat_p256_uint1 x14;
  uint64_t x15;
  fiat_p256_uint1 x16;
  uint64_t x17;
  fiat_p256_uint1 x18;
  uint64_t x19;
  uint64_t x20;
  uint64_t x21;
  uint64_t x22;
  uint64_t x23;
  uint64_t x24;
  uint64_t x25;
  uint64_t x26;
  fiat_p256_uint1 x27;
  uint64_t x28;
  uint64_t x29;
  fiat_p256_uint1 x30;
  uint64_t x31;
  fiat_p256_uint1 x32;
  uint64_t x33;
  fiat_p256_uint1 x34;
  uint64_t x35;
  fiat_p256_uint1 x36;
  uint64_t x37;
  fiat_p256_uint1 x38;
  uint64_t x39;
  uint64_t x40;
  uint64_t x41;
  uint64_t x42;
  uint64_t x43;
  uint64_t x44;
  uint64_t x45;
  uint64_t x46;
  uint64_t x47;
  fiat_p256_uint1 x48;
  uint64_t x49;
  fiat_p256_uint1 x50;
  uint64_t x51;
  fiat_p256_uint1 x52;
  uint64_t x53;
  uint64_t x54;
  fiat_p256_uint1 x55;
  uint64_t x56;
  fiat_p256_uint1 x57;
  uint64_t x58;
  fiat_p256_uint1 x59;
  uint64_t x60;
  fiat_p256_uint1 x61;
  uint64_t x62;
  fiat_p256_uint1 x63;
  uint64_t x64;
  uint64_t x65;
  uint64_t x66;
  uint64_t x67;
  uint64_t x68;
  uint64_t x69;
  uint64_t x70;
  fiat_p256_uint1 x71;
  uint64_t x72;
  uint64_t x73;
  fiat_p256_uint1 x74;
  uint64_t x75;
  fiat_p256_uint1 x76;
  uint64_t x77;
  fiat_p256_uint1 x78;
  uint64_t x79;
  fiat_p256_uint1 x80;
  uint64_t x81;
  fiat_p256_uint1 x82;
  uint64_t x83;
  uint64_t x84;
  uint64_t x85;
  uint64_t x86;
  uint64_t x87;
  uint64_t x88;
  uint64_t x89;
  uint64_t x90;
  uint64_t x91;
  uint64_t x92;
  fiat_p256_uint1 x93;
  uint64_t x94;
  fiat_p256_uint1 x95;
  uint64_t x96;
  fiat_p256_uint1 x97;
  uint64_t x98;
  uint64_t x99;
  fiat_p256_uint1 x100;
  uint64_t x101;
  fiat_p256_uint1 x102;
  uint64_t x103;
  fiat_p256_uint1 x104;
  uint64_t x105;
  fiat_p256_uint1 x106;
  uint64_t x107;
  fiat_p256_uint1 x108;
  uint64_t x109;
  uint64_t x110;
  uint64_t x111;
  uint64_t x112;
  uint64_t x113;
  uint64_t x114;
  uint64_t x115;
  fiat_p256_uint1 x116;
  uint64_t x117;
  uint64_t x118;
  fiat_p256_uint1 x119;
  uint64_t x120;
  fiat_p256_uint1 x121;
  uint64_t x122;
  fiat_p256_uint1 x123;
  uint64_t x124;
  fiat_p256_uint1 x125;
  uint64_t x126;
  fiat_p256_uint1 x127;
  uint64_t x128;
  uint64_t x129;
  uint64_t x130;
  uint64_t x131;
  uint64_t x132;
  uint64_t x133;
  uint64_t x134;
  uint64_t x135;
  uint64_t x136;
  uint64_t x137;
  fiat_p256_uint1 x138;
  uint64_t x139;
  fiat_p256_uint1 x140;
  uint64_t x141;
  fiat_p256_uint1 x142;
  uint64_t x143;
  uint64_t x144;
  fiat_p256_uint1 x145;
  uint64_t x146;
  fiat_p256_uint1 x147;
  uint64_t x148;
  fiat_p256_uint1 x149;
  uint64_t x150;
  fiat_p256_uint1 x151;
  uint64_t x152;
  fiat_p256_uint1 x153;
  uint64_t x154;
  uint64_t x155;
  uint64_t x156;
  uint64_t x157;
  uint64_t x158;
  uint64_t x159;
  uint64_t x160;
  fiat_p256_uint1 x161;
  uint64_t x162;
  uint64_t x163;
  fiat_p256_uint1 x164;
  uint64_t x165;
  fiat_p256_uint1 x166;
  uint64_t x167;
  fiat_p256_uint1 x168;
  uint64_t x169;
  fiat_p256_uint1 x170;
  uint64_t x171;
  fiat_p256_uint1 x172;
  uint64_t x173;
  uint64_t x174;
  fiat_p256_uint1 x175;
  uint64_t x176;
  fiat_p256_uint1 x177;
  uint64_t x178;
  fiat_p256_uint1 x179;
  uint64_t x180;
  fiat_p256_uint1 x181;
  uint64_t x182;
  fiat_p256_uint1 x183;
  uint64_t x184;
  uint64_t x185;
  uint64_t x186;
  uint64_t x187;
  x1 = (arg1[1]);
  x2 = (arg1[2]);
  x3 = (arg1[3]);
  x4 = (arg1[0]);
  fiat_p256_mulx_u64(&x5, &x6, x4, (arg2[3]));
  fiat_p256_mulx_u64(&x7, &x8, x4, (arg2[2]));
  fiat_p256_mulx_u64(&x9, &x10, x4, (arg2[1]));
  fiat_p256_mulx_u64(&x11, &x12, x4, (arg2[0]));
  fiat_p256_addcarryx_u64(&x13, &x14, 0x0, x12, x9);
  fiat_p256_addcarryx_u64(&x15, &x16, x14, x10, x7);
  fiat_p256_addcarryx_u64(&x17, &x18, x16, x8, x5);
  x19 = (x18 + x6);
  fiat_p256_mulx_u64(&x20, &x21, x11, UINT64_C(0xffffffff00000001));
  fiat_p256_mulx_u64(&x22, &x23, x11, UINT32_C(0xffffffff));
  fiat_p256_mulx_u64(&x24, &x25, x11, UINT64_C(0xffffffffffffffff));
  fiat_p256_addcarryx_u64(&x26, &x27, 0x0, x25, x22);
  x28 = (x27 + x23);
  fiat_p256_addcarryx_u64(&x29, &x30, 0x0, x11, x24);
  fiat_p256_addcarryx_u64(&x31, &x32, x30, x13, x26);
  fiat_p256_addcarryx_u64(&x33, &x34, x32, x15, x28);
  fiat_p256_addcarryx_u64(&x35, &x36, x34, x17, x20);
  fiat_p256_addcarryx_u64(&x37, &x38, x36, x19, x21);
  fiat_p256_mulx_u64(&x39, &x40, x1, (arg2[3]));
  fiat_p256_mulx_u64(&x41, &x42, x1, (arg2[2]));
  fiat_p256_mulx_u64(&x43, &x44, x1, (arg2[1]));
  fiat_p256_mulx_u64(&x45, &x46, x1, (arg2[0]));
  fiat_p256_addcarryx_u64(&x47, &x48, 0x0, x46, x43);
  fiat_p256_addcarryx_u64(&x49, &x50, x48, x44, x41);
  fiat_p256_addcarryx_u64(&x51, &x52, x50, x42, x39);
  x53 = (x52 + x40);
  fiat_p256_addcarryx_u64(&x54, &x55, 0x0, x31, x45);
  fiat_p256_addcarryx_u64(&x56, &x57, x55, x33, x47);
  fiat_p256_addcarryx_u64(&x58, &x59, x57, x35, x49);
  fiat_p256_addcarryx_u64(&x60, &x61, x59, x37, x51);
  fiat_p256_addcarryx_u64(&x62, &x63, x61, x38, x53);
  fiat_p256_mulx_u64(&x64, &x65, x54, UINT64_C(0xffffffff00000001));
  fiat_p256_mulx_u64(&x66, &x67, x54, UINT32_C(0xffffffff));
  fiat_p256_mulx_u64(&x68, &x69, x54, UINT64_C(0xffffffffffffffff));
  fiat_p256_addcarryx_u64(&x70, &x71, 0x0, x69, x66);
  x72 = (x71 + x67);
  fiat_p256_addcarryx_u64(&x73, &x74, 0x0, x54, x68);
  fiat_p256_addcarryx_u64(&x75, &x76, x74, x56, x70);
  fiat_p256_addcarryx_u64(&x77, &x78, x76, x58, x72);
  fiat_p256_addcarryx_u64(&x79, &x80, x78, x60, x64);
  fiat_p256_addcarryx_u64(&x81, &x82, x80, x62, x65);
  x83 = ((uint64_t)x82 + x63);
  fiat_p256_mulx_u64(&x84, &x85, x2, (arg2[3]));
  fiat_p256_mulx_u64(&x86, &x87, x2, (arg2[2]));
  fiat_p256_mulx_u64(&x88, &x89, x2, (arg2[1]));
  fiat_p256_mulx_u64(&x90, &x91, x2, (arg2[0]));
  fiat_p256_addcarryx_u64(&x92, &x93, 0x0, x91, x88);
  fiat_p256_addcarryx_u64(&x94, &x95, x93, x89, x86);
  fiat_p256_addcarryx_u64(&x96, &x97, x95, x87, x84);
  x98 = (x97 + x85);
  fiat_p256_addcarryx_u64(&x99, &x100, 0x0, x75, x90);
  fiat_p256_addcarryx_u64(&x101, &x102, x100, x77, x92);
  fiat_p256_addcarryx_u64(&x103, &x104, x102, x79, x94);
  fiat_p256_addcarryx_u64(&x105, &x106, x104, x81, x96);
  fiat_p256_addcarryx_u64(&x107, &x108, x106, x83, x98);
  fiat_p256_mulx_u64(&x109, &x110, x99, UINT64_C(0xffffffff00000001));
  fiat_p256_mulx_u64(&x111, &x112, x99, UINT32_C(0xffffffff));
  fiat_p256_mulx_u64(&x113, &x114, x99, UINT64_C(0xffffffffffffffff));
  fiat_p256_addcarryx_u64(&x115, &x116, 0x0, x114, x111);
  x117 = (x116 + x112);
  fiat_p256_addcarryx_u64(&x118, &x119, 0x0, x99, x113);
  fiat_p256_addcarryx_u64(&x120, &x121, x119, x101, x115);
  fiat_p256_addcarryx_u64(&x122, &x123, x121, x103, x117);
  fiat_p256_addcarryx_u64(&x124, &x125, x123, x105, x109);
  fiat_p256_addcarryx_u64(&x126, &x127, x125, x107, x110);
  x128 = ((uint64_t)x127 + x108);
  fiat_p256_mulx_u64(&x129, &x130, x3, (arg2[3]));
  fiat_p256_mulx_u64(&x131, &x132, x3, (arg2[2]));
  fiat_p256_mulx_u64(&x133, &x134, x3, (arg2[1]));
  fiat_p256_mulx_u64(&x135, &x136, x3, (arg2[0]));
  fiat_p256_addcarryx_u64(&x137, &x138, 0x0, x136, x133);
  fiat_p256_addcarryx_u64(&x139, &x140, x138, x134, x131);
  fiat_p256_addcarryx_u64(&x141, &x142, x140, x132, x129);
  x143 = (x142 + x130);
  fiat_p256_addcarryx_u64(&x144, &x145, 0x0, x120, x135);
  fiat_p256_addcarryx_u64(&x146, &x147, x145, x122, x137);
  fiat_p256_addcarryx_u64(&x148, &x149, x147, x124, x139);
  fiat_p256_addcarryx_u64(&x150, &x151, x149, x126, x141);
  fiat_p256_addcarryx_u64(&x152, &x153, x151, x128, x143);
  fiat_p256_mulx_u64(&x154, &x155, x144, UINT64_C(0xffffffff00000001));
  fiat_p256_mulx_u64(&x156, &x157, x144, UINT32_C(0xffffffff));
  fiat_p256_mulx_u64(&x158, &x159, x144, UINT64_C(0xffffffffffffffff));
  fiat_p256_addcarryx_u64(&x160, &x161, 0x0, x159, x156);
  x162 = (x161 + x157);
  fiat_p256_addcarryx_u64(&x163, &x164, 0x0, x144, x158);
  fiat_p256_addcarryx_u64(&x165, &x166, x164, x146, x160);
  fiat_p256_addcarryx_u64(&x167, &x168, x166, x148, x162);
  fiat_p256_addcarryx_u64(&x169, &x170, x168, x150, x154);
  fiat_p256_addcarryx_u64(&x171, &x172, x170, x152, x155);
  x173 = ((uint64_t)x172 + x153);
  fiat_p256_subborrowx_u64(&x174, &x175, 0x0, x165, UINT64_C(0xffffffffffffffff));
  fiat_p256_subborrowx_u64(&x176, &x177, x175, x167, UINT32_C(0xffffffff));
  fiat_p256_subborrowx_u64(&x178, &x179, x177, x169, 0x0);
  fiat_p256_subborrowx_u64(&x180, &x181, x179, x171, UINT64_C(0xffffffff00000001));
  fiat_p256_subborrowx_u64(&x182, &x183, x181, x173, 0x0);
  fiat_p256_cmovznz_u64(&x184, x183, x174, x165);
  fiat_p256_cmovznz_u64(&x185, x183, x176, x167);
  fiat_p256_cmovznz_u64(&x186, x183, x178, x169);
  fiat_p256_cmovznz_u64(&x187, x183, x180, x171);
  out1[0] = x184;
  out1[1] = x185;
  out1[2] = x186;
  out1[3] = x187;
}